

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloccommon.c
# Opt level: O2

int av1_alloc_above_context_buffers
              (CommonContexts *above_contexts,int num_tile_rows,int num_mi_cols,int num_planes)

{
  ENTROPY_CONTEXT ***pppEVar1;
  ENTROPY_CONTEXT **ppEVar2;
  TXFM_CONTEXT **ppTVar3;
  ulong uVar4;
  ENTROPY_CONTEXT *pEVar5;
  TXFM_CONTEXT *pTVar6;
  ulong uVar7;
  ulong uVar8;
  int plane_idx;
  uint uVar9;
  size_t num;
  ulong uVar10;
  
  uVar9 = num_mi_cols + 0x1fU & 0xffffffe0;
  above_contexts->num_tile_rows = num_tile_rows;
  above_contexts->num_mi_cols = uVar9;
  above_contexts->num_planes = num_planes;
  num = (size_t)num_tile_rows;
  uVar10 = 0;
  uVar8 = (ulong)(uint)num_planes;
  if (num_planes < 1) {
    uVar8 = uVar10;
  }
  while (ppEVar2 = (ENTROPY_CONTEXT **)aom_calloc(num,8), uVar8 != uVar10) {
    above_contexts->entropy[uVar10] = ppEVar2;
    uVar10 = uVar10 + 1;
    if (ppEVar2 == (ENTROPY_CONTEXT **)0x0) {
      return 1;
    }
  }
  above_contexts->partition = ppEVar2;
  if (ppEVar2 == (ENTROPY_CONTEXT **)0x0) {
    return 1;
  }
  ppTVar3 = (TXFM_CONTEXT **)aom_calloc(num,8);
  above_contexts->txfm = ppTVar3;
  if (ppTVar3 == (TXFM_CONTEXT **)0x0) {
    return 1;
  }
  uVar10 = 0;
  uVar7 = (ulong)(uint)num_tile_rows;
  if (num_tile_rows < 1) {
    uVar7 = uVar10;
  }
  while (uVar4 = uVar10, uVar4 != uVar7) {
    uVar10 = 0;
    while (pEVar5 = (ENTROPY_CONTEXT *)aom_calloc((long)(int)uVar9,1), uVar8 != uVar10) {
      above_contexts->entropy[uVar10][uVar4] = pEVar5;
      pppEVar1 = above_contexts->entropy + uVar10;
      uVar10 = uVar10 + 1;
      if ((*pppEVar1)[uVar4] == (ENTROPY_CONTEXT *)0x0) goto LAB_0031d0d4;
    }
    above_contexts->partition[uVar4] = pEVar5;
    if (above_contexts->partition[uVar4] == (PARTITION_CONTEXT *)0x0) break;
    pTVar6 = (TXFM_CONTEXT *)aom_calloc((long)(int)uVar9,1);
    above_contexts->txfm[uVar4] = pTVar6;
    uVar10 = uVar4 + 1;
    if (above_contexts->txfm[uVar4] == (TXFM_CONTEXT *)0x0) break;
  }
LAB_0031d0d4:
  return (uint)((long)uVar4 < (long)num);
}

Assistant:

int av1_alloc_above_context_buffers(CommonContexts *above_contexts,
                                    int num_tile_rows, int num_mi_cols,
                                    int num_planes) {
  const int aligned_mi_cols =
      ALIGN_POWER_OF_TWO(num_mi_cols, MAX_MIB_SIZE_LOG2);

  // Allocate above context buffers
  above_contexts->num_tile_rows = num_tile_rows;
  above_contexts->num_mi_cols = aligned_mi_cols;
  above_contexts->num_planes = num_planes;
  for (int plane_idx = 0; plane_idx < num_planes; plane_idx++) {
    above_contexts->entropy[plane_idx] = (ENTROPY_CONTEXT **)aom_calloc(
        num_tile_rows, sizeof(above_contexts->entropy[0]));
    if (!above_contexts->entropy[plane_idx]) return 1;
  }

  above_contexts->partition = (PARTITION_CONTEXT **)aom_calloc(
      num_tile_rows, sizeof(above_contexts->partition));
  if (!above_contexts->partition) return 1;

  above_contexts->txfm =
      (TXFM_CONTEXT **)aom_calloc(num_tile_rows, sizeof(above_contexts->txfm));
  if (!above_contexts->txfm) return 1;

  for (int tile_row = 0; tile_row < num_tile_rows; tile_row++) {
    for (int plane_idx = 0; plane_idx < num_planes; plane_idx++) {
      above_contexts->entropy[plane_idx][tile_row] =
          (ENTROPY_CONTEXT *)aom_calloc(
              aligned_mi_cols, sizeof(*above_contexts->entropy[0][tile_row]));
      if (!above_contexts->entropy[plane_idx][tile_row]) return 1;
    }

    above_contexts->partition[tile_row] = (PARTITION_CONTEXT *)aom_calloc(
        aligned_mi_cols, sizeof(*above_contexts->partition[tile_row]));
    if (!above_contexts->partition[tile_row]) return 1;

    above_contexts->txfm[tile_row] = (TXFM_CONTEXT *)aom_calloc(
        aligned_mi_cols, sizeof(*above_contexts->txfm[tile_row]));
    if (!above_contexts->txfm[tile_row]) return 1;
  }

  return 0;
}